

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_linear_least_squares.cpp
# Opt level: O2

int __thiscall
SubstrateConcentrationFunctor::operator()
          (SubstrateConcentrationFunctor *this,VectorXd *z,VectorXd *r)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ulong i;
  CoeffReturnType CVar6;
  CoeffReturnType CVar7;
  DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
  local_68 [56];
  
  for (uVar3 = 0; i = (ulong)uVar3,
      (long)i < (this->Points).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows; uVar3 = uVar3 + 1) {
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               &this->Points,i);
    CVar6 = Eigen::
            DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>
            ::operator()(local_68,1);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               &this->Points,i);
    CVar7 = Eigen::
            DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>
            ::operator()(local_68,0);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,0);
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,1);
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)r,i);
    *pSVar5 = CVar6 - (dVar1 * CVar7) / (CVar7 + dVar2);
  }
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &r) const
    {
        double x_i,y_i,beta1,beta2;
        for(unsigned int i = 0; i < this->Points.rows(); ++i)
        {
            y_i=this->Points.row(i)(1);
            x_i=this->Points.row(i)(0);
            beta1=z(0);
            beta2=z(1);
            r(i) =y_i-(beta1*x_i) /(beta2+x_i);
        }

        return 0;
    }